

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

bool __thiscall
kj::anon_unknown_9::DiskHandle::tryMkdir(DiskHandle *this,PathPtr path,WriteMode mode,bool noThrow)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  __mode_t __mode;
  PathPtr *this_00;
  bool bVar7;
  PathPtr PVar8;
  String filename;
  stat stats;
  String local_e8;
  PathPtr local_d0;
  stat64 local_c0;
  
  local_d0.parts.size_ = path.parts.size_;
  local_d0.parts.ptr = path.parts.ptr;
  this_00 = &local_d0;
  PathPtr::toString(&local_e8,this_00,false);
  __mode = 0x1c0;
  if ((mode & PRIVATE) == 0) {
    __mode = 0x1ff;
  }
  do {
    pcVar6 = "";
    if (local_e8.content.size_ != 0) {
      pcVar6 = local_e8.content.ptr;
    }
    iVar2 = mkdirat((this->fd).fd,pcVar6,__mode);
    if (-1 < iVar2) {
      iVar2 = 0;
      break;
    }
    iVar2 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 == 0) {
    bVar7 = true;
    goto LAB_0048e5c2;
  }
  if (iVar2 == 2) {
    if (((mode & CREATE_PARENT) != 0) && (local_d0.parts.size_ != 0)) {
      PVar8 = PathPtr::parent(&local_d0);
      bVar7 = tryMkdir(this,PVar8,CREATE_PARENT|MODIFY|CREATE,true);
      if (bVar7) {
        PVar8.parts.size_ = local_d0.parts.size_;
        PVar8.parts.ptr = local_d0.parts.ptr;
        bVar7 = tryMkdir(this,PVar8,mode & ~CREATE_PARENT,noThrow);
        goto LAB_0048e5c2;
      }
    }
LAB_0048e5b3:
    if (!noThrow) {
LAB_0048e603:
      kj::_::Debug::Fault::Fault<int,kj::PathPtr&>
                ((Fault *)&local_c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x374,iVar2,"mkdirat(fd, path)","path",&local_d0);
      kj::_::Debug::Fault::fatal((Fault *)&local_c0);
    }
  }
  else {
    if (iVar2 != 0x11) goto LAB_0048e5b3;
    if ((mode & MODIFY) != 0) {
      do {
        pcVar6 = "";
        if (local_e8.content.size_ != 0) {
          pcVar6 = local_e8.content.ptr;
        }
        iVar5 = 0;
        iVar3 = fstatat64((this->fd).fd,pcVar6,&local_c0,0);
        if (-1 < iVar3) break;
        uVar4 = kj::_::Debug::getOsErrorNumber(false);
        this_00 = (PathPtr *)((ulong)this_00 & 0xffffffff);
        if (uVar4 != 0xffffffff) {
          this_00 = (PathPtr *)(ulong)uVar4;
        }
        iVar5 = (int)this_00;
      } while (uVar4 == 0xffffffff);
      if (noThrow || iVar5 == 0) {
        bVar7 = iVar5 == 0 && (local_c0.st_mode & 0xf000) == 0x4000;
        goto LAB_0048e5c2;
      }
      goto LAB_0048e603;
    }
  }
  bVar7 = false;
LAB_0048e5c2:
  sVar1 = local_e8.content.size_;
  pcVar6 = local_e8.content.ptr;
  if (local_e8.content.ptr != (char *)0x0) {
    local_e8.content.ptr = (char *)0x0;
    local_e8.content.size_ = 0;
    (**(local_e8.content.disposer)->_vptr_ArrayDisposer)
              (local_e8.content.disposer,pcVar6,1,sVar1,sVar1,0);
  }
  return bVar7;
}

Assistant:

bool tryMkdir(PathPtr path, WriteMode mode, bool noThrow) const {
    // Internal function to make a directory.

    auto filename = path.toString();
    mode_t acl = has(mode, WriteMode::PRIVATE) ? 0700 : 0777;

    KJ_SYSCALL_HANDLE_ERRORS(mkdirat(fd, filename.cStr(), acl)) {
      case EEXIST: {
        // Apparently this path exists.
        if (!has(mode, WriteMode::MODIFY)) {
          // Require exclusive create.
          return false;
        }

        // MODIFY is allowed, so we just need to check whether the existing entry is a directory.
        struct stat stats;
        KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd, filename.cStr(), &stats, 0)) {
          default:
            // mkdir() says EEXIST but we can't stat it. Maybe it's a dangling link, or maybe
            // we can't access it for some reason. Assume failure.
            //
            // TODO(someday): Maybe we should be creating the directory at the target of the
            //   link?
            goto failed;
        }
        return (stats.st_mode & S_IFMT) == S_IFDIR;
      }
      case ENOENT:
        if (has(mode, WriteMode::CREATE_PARENT) && path.size() > 0 &&
            tryMkdir(path.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                    WriteMode::CREATE_PARENT, true)) {
          // Retry, but make sure we don't try to create the parent again.
          return tryMkdir(path, mode - WriteMode::CREATE_PARENT, noThrow);
        } else {
          goto failed;
        }
      default:
      failed:
        if (noThrow) {
          // Caller requested no throwing.
          return false;
        } else {
          KJ_FAIL_SYSCALL("mkdirat(fd, path)", error, path);
        }
    }

    return true;
  }